

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_connective.c
# Opt level: O0

void * select_new(t_symbol *s,int argc,t_atom *argv)

{
  int iVar1;
  _outlet *p_Var2;
  _binbuf *p_Var3;
  t_pd p_Var4;
  t_float tVar5;
  t_sel2 *x_1;
  t_selectelement *e;
  int n;
  t_sel1 *x;
  t_atom a;
  t_atom *argv_local;
  int argc_local;
  t_symbol *s_local;
  
  a.a_w = (word)argv;
  argv_local._4_4_ = argc;
  if (argc == 0) {
    argv_local._4_4_ = 1;
    x._0_4_ = 1;
    a.a_type = A_NULL;
    a.a_w.w_symbol = (t_symbol *)&x;
  }
  if (argv_local._4_4_ == 1) {
    s_local = (t_symbol *)pd_new(sel1_class);
    (((t_object *)((long)s_local + 0x30))->te_g).g_pd = (t_pd)(a.a_w.w_symbol)->s_name;
    (((t_object *)((long)s_local + 0x30))->te_g).g_next = (_gobj *)(a.a_w.w_symbol)->s_thing;
    p_Var2 = outlet_new((t_object *)s_local,&s_bang);
    ((t_object *)((long)s_local + 0x30))->te_binbuf = (_binbuf *)p_Var2;
    if ((a.a_w.w_array)->a_n == 1) {
      floatinlet_new((t_object *)s_local,
                     (t_float *)&(((t_object *)((long)s_local + 0x30))->te_g).g_next);
      p_Var2 = outlet_new((t_object *)s_local,&s_float);
      ((t_object *)((long)s_local + 0x30))->te_outlet = p_Var2;
    }
    else {
      symbolinlet_new((t_object *)s_local,
                      (t_symbol **)&(((t_object *)((long)s_local + 0x30))->te_g).g_next);
      p_Var2 = outlet_new((t_object *)s_local,&s_symbol);
      ((t_object *)((long)s_local + 0x30))->te_outlet = p_Var2;
    }
  }
  else {
    s_local = (t_symbol *)pd_new(sel2_class);
    (((t_object *)((long)s_local + 0x30))->te_g).g_next = (_gobj *)(long)argv_local._4_4_;
    p_Var3 = (_binbuf *)getbytes((long)argv_local._4_4_ << 4);
    ((t_object *)((long)s_local + 0x30))->te_binbuf = p_Var3;
    *(int *)&(((t_object *)((long)s_local + 0x30))->te_g).g_pd = (a.a_w.w_array)->a_n;
    e._4_4_ = 0;
    x_1 = (t_sel2 *)((t_object *)((long)s_local + 0x30))->te_binbuf;
    for (; e._4_4_ < argv_local._4_4_; e._4_4_ = e._4_4_ + 1) {
      p_Var2 = outlet_new((t_object *)s_local,&s_bang);
      (x_1->x_obj).te_g.g_next = (_gobj *)p_Var2;
      iVar1 = (a.a_w.w_array)->a_n;
      *(int *)&(((t_object *)((long)s_local + 0x30))->te_g).g_pd = iVar1;
      if (iVar1 == 1) {
        tVar5 = atom_getfloatarg(e._4_4_,argv_local._4_4_,a.a_w);
        *(t_float *)&(x_1->x_obj).te_g.g_pd = tVar5;
      }
      else {
        p_Var4 = (t_pd)atom_getsymbolarg(e._4_4_,argv_local._4_4_,(t_atom *)a.a_w.w_symbol);
        (x_1->x_obj).te_g.g_pd = p_Var4;
      }
      x_1 = (t_sel2 *)&(x_1->x_obj).te_binbuf;
    }
    p_Var2 = outlet_new((t_object *)s_local,&s_float);
    ((t_object *)((long)s_local + 0x30))->te_outlet = p_Var2;
  }
  return s_local;
}

Assistant:

static void *select_new(t_symbol *s, int argc, t_atom *argv)
{
    t_atom a;
    if (argc == 0)
    {
        argc = 1;
        SETFLOAT(&a, 0);
        argv = &a;
    }
    if (argc == 1)
    {
        t_sel1 *x = (t_sel1 *)pd_new(sel1_class);
        x->x_atom = *argv;
        x->x_outlet1 = outlet_new(&x->x_obj, &s_bang);
        if (argv->a_type == A_FLOAT)
        {
            floatinlet_new(&x->x_obj, &x->x_atom.a_w.w_float);
            x->x_outlet2 = outlet_new(&x->x_obj, &s_float);
        }
        else
        {
            symbolinlet_new(&x->x_obj, &x->x_atom.a_w.w_symbol);
            x->x_outlet2 = outlet_new(&x->x_obj, &s_symbol);
        }
        return (x);
    }
    else
    {
        int n;
        t_selectelement *e;
        t_sel2 *x = (t_sel2 *)pd_new(sel2_class);
        x->x_nelement = argc;
        x->x_vec = (t_selectelement *)getbytes(argc * sizeof(*x->x_vec));
        x->x_type = argv[0].a_type;
        for (n = 0, e = x->x_vec; n < argc; n++, e++)
        {
            e->e_outlet = outlet_new(&x->x_obj, &s_bang);
            if ((x->x_type = argv->a_type) == A_FLOAT)
                e->e_w.w_float = atom_getfloatarg(n, argc, argv);
            else e->e_w.w_symbol = atom_getsymbolarg(n, argc, argv);
        }
        x->x_rejectout = outlet_new(&x->x_obj, &s_float);
        return (x);
    }

}